

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O2

void NULLCIO::WriteLongConsole(longlong number,int base)

{
  char cVar1;
  undefined8 uVar2;
  code *pcVar3;
  ulong uVar4;
  longlong lVar5;
  long lVar6;
  size_t sVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  char *pcVar11;
  char buf [128];
  char local_98 [128];
  
  pcVar3 = writeFunc;
  uVar2 = contextFunc;
  if (base - 2U < 0xf) {
    if (writeFunc != (code *)0x0) {
      uVar10 = (ulong)(uint)base;
      iVar9 = (int)(number % (long)uVar10);
      uVar4 = (ulong)(uint)-iVar9;
      if (0 < iVar9) {
        uVar4 = number % (long)uVar10 & 0xffffffff;
      }
      pcVar11 = local_98;
      local_98[0] = "0123456789abcdef"[uVar4];
      lVar5 = number;
      while (pcVar11 = pcVar11 + 1, lVar5 = lVar5 / (long)uVar10, lVar5 != 0) {
        iVar9 = (int)(lVar5 % (long)uVar10);
        uVar4 = (ulong)(uint)-iVar9;
        if (0 < iVar9) {
          uVar4 = lVar5 % (long)uVar10 & 0xffffffff;
        }
        *pcVar11 = "0123456789abcdef"[uVar4];
      }
      if (number < 0) {
        *pcVar11 = '-';
        pcVar11 = pcVar11 + 1;
      }
      *pcVar11 = '\0';
      uVar8 = (int)((int)pcVar11 - (uint)local_98) >> 1;
      uVar10 = 0;
      uVar4 = (ulong)uVar8;
      if ((int)uVar8 < 1) {
        uVar4 = uVar10;
      }
      lVar6 = (ulong)(~(uint)local_98 + (int)pcVar11) << 0x20;
      for (; uVar4 != uVar10; uVar10 = uVar10 + 1) {
        cVar1 = local_98[uVar10];
        local_98[uVar10] = local_98[lVar6 >> 0x20];
        local_98[lVar6 >> 0x20] = cVar1;
        lVar6 = lVar6 + -0x100000000;
      }
      sVar7 = strlen(local_98);
      (*pcVar3)(uVar2,local_98,sVar7 & 0xffffffff);
    }
    return;
  }
  nullcThrowError("ERROR: incorrect base %d");
  return;
}

Assistant:

void WriteLongConsole(long long number, int base)
	{
		if(!(base > 1 && base <= 16))
		{
			nullcThrowError("ERROR: incorrect base %d", base);
			return;
		}

		if(!writeFunc)
			return;

		static char symb[] = "0123456789abcdef";
		bool sign = 0;
		char buf[128];
		char *curr = buf;
		if(number < 0)
			sign = 1;

		*curr++ = *(abs(number % base) + symb);
		while(number /= base)
			*curr++ = *(abs(number % base) + symb);
		if(sign)
			*curr++ = '-';
		*curr = 0;
		int size = int(curr - buf), halfsize = size >> 1;
		for(int i = 0; i < halfsize; i++)
		{
			char tmp = buf[i];
			buf[i] = buf[size-i-1];
			buf[size-i-1] = tmp;
		}

		writeFunc(contextFunc, buf, (unsigned)strlen(buf));
	}